

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O3

bool __thiscall
ON_3dmObjectAttributes::IsInGroups(ON_3dmObjectAttributes *this,int group_count,int *group_list)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (group_list == (int *)0x0 || group_count < 1) {
    return false;
  }
  lVar1 = (long)(this->m_group).m_count;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      uVar3 = 0;
      do {
        if ((this->m_group).m_a[lVar2] == group_list[uVar3]) {
          return true;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)group_count != uVar3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != lVar1);
  }
  return false;
}

Assistant:

bool ON_3dmObjectAttributes::IsInGroups( int group_count, const int* group_list ) const
{
  // returns true if object is in any of the groups in the list
  bool rc = false;
  if ( group_count > 0 && group_list ) {
    const int obj_group_count  = GroupCount();
    const int* obj_group_list = GroupList();
    // in practice these arrays will be very short and this search will be fast
    int i, j;
    for ( i = 0; i < obj_group_count; i++ ) for ( j = 0; j < group_count; j++ ) {
      if ( obj_group_list[i] == group_list[j] )
        return true;
    }
  }
  return rc;
}